

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O2

int is_alike_mv(int_mv candidate_mv,center_mv_t *center_mvs,int center_mvs_count,
               int skip_alike_starting_mv)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  
  uVar1 = (ulong)(uint)center_mvs_count;
  if (center_mvs_count < 1) {
    uVar1 = 0;
  }
  uVar4 = 0;
  do {
    if (uVar1 == uVar4) {
      return 0;
    }
    iVar5 = (int)center_mvs[uVar4].mv.as_mv.col - ((int)candidate_mv.as_int >> 0x10);
    iVar2 = -iVar5;
    if (0 < iVar5) {
      iVar2 = iVar5;
    }
    if (iVar2 < (int)*(uint *)(&DAT_0046ca88 + (long)skip_alike_starting_mv * 4)) {
      uVar6 = (int)center_mvs[uVar4].mv.as_mv.row - (int)candidate_mv.as_mv.row;
      uVar3 = -uVar6;
      if (0 < (int)uVar6) {
        uVar3 = uVar6;
      }
      if (uVar3 < *(uint *)(&DAT_0046ca88 + (long)skip_alike_starting_mv * 4)) {
        return 1;
      }
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

static int is_alike_mv(int_mv candidate_mv, center_mv_t *center_mvs,
                       int center_mvs_count, int skip_alike_starting_mv) {
  // MV difference threshold is in 1/8 precision.
  const int mv_diff_thr[3] = { 1, (8 << 3), (16 << 3) };
  int thr = mv_diff_thr[skip_alike_starting_mv];
  int i;

  for (i = 0; i < center_mvs_count; i++) {
    if (abs(center_mvs[i].mv.as_mv.col - candidate_mv.as_mv.col) < thr &&
        abs(center_mvs[i].mv.as_mv.row - candidate_mv.as_mv.row) < thr)
      return 1;
  }

  return 0;
}